

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O1

int cmime_string_is_7bit(char *s)

{
  char cVar1;
  char *pcVar2;
  
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_string.c"
                  ,100,"int cmime_string_is_7bit(const char *)");
  }
  cVar1 = *s;
  if (cVar1 != '\0') {
    pcVar2 = s + 1;
    do {
      if (cVar1 < '\0') {
        return -1;
      }
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return 0;
}

Assistant:

int cmime_string_is_7bit(const char *s) {
    const char *it = NULL;
    assert(s);

    it = s;
    while(*it != '\0') {
        if (((unsigned char)(*it) > (unsigned char) 127)||(*it < 0))
            return(-1);
        it++;
    }

    return(0);
}